

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateArgsortLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint32 __val;
  long __val_00;
  bool bVar1;
  Result *pRVar2;
  ArgSortLayerParams *pAVar3;
  Type *pTVar4;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  Result r;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,1,1);
  pRVar2 = Result::operator=(&r,(Result *)&err);
  bVar1 = Result::good(pRVar2);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  if (bVar1) {
    validateOutputCount((Result *)&err,layer,1,1);
    pRVar2 = Result::operator=(&r,(Result *)&err);
    bVar1 = Result::good(pRVar2);
    std::__cxx11::string::~string((string *)&err._M_string_length);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_40,"Argsort",(allocator *)&local_148);
      validateInputOutputRankEquality((Result *)&err,layer,&local_40,&this->blobNameToRank);
      pRVar2 = Result::operator=(&r,(Result *)&err);
      bVar1 = Result::good(pRVar2);
      std::__cxx11::string::~string((string *)&err._M_string_length);
      std::__cxx11::string::~string((string *)&local_40);
      if (bVar1) {
        pAVar3 = Specification::NeuralNetworkLayer::argsort(layer);
        if (pAVar3->axis_ < 0) {
          std::operator+(&local_148,
                         "Value of \'axis\' is negative for layer of type \'ArgSort\' and name \'",
                         (layer->name_).ptr_);
          std::operator+(&err,&local_148,"\', which is not supported. It must be positive.");
          std::__cxx11::string::~string((string *)&local_148);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
LAB_00258120:
          std::__cxx11::string::~string((string *)&err);
          goto LAB_00257fa3;
        }
        if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
          pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                             (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
          __val = pTVar4->rank_;
          __val_00 = pAVar3->axis_;
          if ((__val_00 < 0) || ((int)__val <= __val_00)) {
            std::__cxx11::to_string(&local_e0,__val_00);
            std::operator+(&local_c0,"Value of \'axis\' is ",&local_e0);
            std::operator+(&local_a0,&local_c0,", but it must be in the range [0,");
            std::__cxx11::to_string(&local_100,__val);
            std::operator+(&local_80,&local_a0,&local_100);
            std::operator+(&local_60,&local_80,") for layer of type \'ArgSort\' and name \'");
            std::operator+(&local_148,&local_60,(layer->name_).ptr_);
            std::operator+(&err,&local_148,"\'.");
            std::__cxx11::string::~string((string *)&local_148);
            std::__cxx11::string::~string((string *)&local_60);
            std::__cxx11::string::~string((string *)&local_80);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_a0);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&local_e0);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
            goto LAB_00258120;
          }
        }
      }
    }
  }
  Result::Result(__return_storage_ptr__,&r);
LAB_00257fa3:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateArgsortLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 1, 1)).good()) return r;
    if (!(r = validateOutputCount(layer, 1, 1)).good()) return r;
    if (!(r = validateInputOutputRankEquality(layer, "Argsort", blobNameToRank)).good()) return r;

    const auto& params = layer.argsort();

    if (params.axis() < 0) {
        const std::string err = "Value of 'axis' is negative for layer of type 'ArgSort' and name '" + layer.name() + "', which is not supported. It must be positive.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < 0 || params.axis() >= rank) {
            const std::string err = "Value of 'axis' is " + std::to_string(params.axis()) + \
                                    ", but it must be in the range [0," \
                                    + std::to_string(rank) + ") for layer of type 'ArgSort' and name '" + layer.name() + "'.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return r;
}